

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O2

int lws_timed_callback_vh_protocol_us(lws_vhost *vh,lws_protocols *prot,int reason,lws_usec_t us)

{
  uint uVar1;
  lws_timed_vh_protocol *plVar2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = 0;
  plVar2 = (lws_timed_vh_protocol *)lws_realloc((void *)0x0,0x48,"timed_vh");
  if (plVar2 == (lws_timed_vh_protocol *)0x0) {
    iVar4 = 1;
  }
  else {
    plVar2->protocol = (lws_protocols *)0x0;
    plVar2->vhost = (lws_vhost *)0x0;
    (plVar2->sul).cb = (sul_cb_t)0x0;
    (plVar2->sul).us = 0;
    (plVar2->sul).list.next = (lws_dll2 *)0x0;
    (plVar2->sul).list.owner = (lws_dll2_owner *)0x0;
    plVar2->next = (lws_timed_vh_protocol *)0x0;
    (plVar2->sul).list.prev = (lws_dll2 *)0x0;
    plVar2->reason = 0;
    plVar2->tsi_req = 0;
    uVar1 = lws_pthread_self_to_tsi(vh->context);
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = 0;
    }
    plVar2->tsi_req = (int)uVar3;
    plVar2->protocol = prot;
    plVar2->reason = reason;
    plVar2->vhost = vh;
    (plVar2->sul).cb = lws_sul_timed_callback_vh_protocol_cb;
    __lws_sul_insert(&vh->context->pt[uVar3].pt_sul_owner,&plVar2->sul,us);
    plVar2->next = vh->timed_vh_protocol_list;
    vh->timed_vh_protocol_list = plVar2;
  }
  return iVar4;
}

Assistant:

int
lws_timed_callback_vh_protocol_us(struct lws_vhost *vh,
				  const struct lws_protocols *prot, int reason,
				  lws_usec_t us)
{
	struct lws_timed_vh_protocol *p = (struct lws_timed_vh_protocol *)
			lws_malloc(sizeof(*p), "timed_vh");

	if (!p)
		return 1;

	memset(p, 0, sizeof(*p));

	p->tsi_req = lws_pthread_self_to_tsi(vh->context);
	if (p->tsi_req < 0) /* not called from a service thread --> tsi 0 */
		p->tsi_req = 0;

	lws_context_lock(vh->context, __func__); /* context ----------------- */

	p->protocol = prot;
	p->reason = reason;
	p->vhost = vh;

	p->sul.cb = lws_sul_timed_callback_vh_protocol_cb;
	/* list is always at the very top of the sul */
	__lws_sul_insert(&vh->context->pt[p->tsi_req].pt_sul_owner,
			 (lws_sorted_usec_list_t *)&p->sul.list, us);

	// lwsl_notice("%s: %s.%s %d\n", __func__, vh->name, prot->name, secs);

	lws_vhost_lock(vh); /* vhost ---------------------------------------- */
	p->next = vh->timed_vh_protocol_list;
	vh->timed_vh_protocol_list = p;
	lws_vhost_unlock(vh); /* -------------------------------------- vhost */

	lws_context_unlock(vh->context); /* ------------------------- context */

	return 0;
}